

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O1

void Diligent::ValidatePipelineResourceSignatureDesc
               (PipelineResourceSignatureDesc *Desc,IRenderDevice *pDevice,
               RENDER_DEVICE_TYPE DeviceType)

{
  PipelineResourceDesc *pPVar1;
  ImmutableSamplerDesc *pIVar2;
  char **Args_4;
  SHADER_TYPE *pSVar3;
  PIPELINE_RESOURCE_FLAGS PVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  long *plVar10;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var11;
  SHADER_TYPE SVar12;
  ImmutableSamplerDesc *in_RCX;
  char (*pacVar13) [51];
  char (*Args_1) [48];
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE extraout_EDX;
  SHADER_TYPE extraout_EDX_00;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE extraout_EDX_01;
  SHADER_TYPE extraout_EDX_02;
  SHADER_TYPE extraout_EDX_03;
  SHADER_TYPE extraout_EDX_04;
  SHADER_TYPE extraout_EDX_05;
  SHADER_TYPE extraout_EDX_06;
  SHADER_TYPE extraout_EDX_07;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  extraout_RDX;
  __node_type *extraout_RDX_00;
  __node_type *extraout_RDX_01;
  __node_type *extraout_RDX_02;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  extraout_RDX_03;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  _Var15;
  SHADER_TYPE extraout_EDX_08;
  SHADER_TYPE extraout_EDX_09;
  SHADER_TYPE ShaderStages_00;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  extraout_RDX_04;
  __node_type *extraout_RDX_05;
  __node_type *extraout_RDX_06;
  __node_type *extraout_RDX_07;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  extraout_RDX_08;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  _Var17;
  SHADER_TYPE extraout_EDX_10;
  SHADER_TYPE ShaderStages_01;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  extraout_RDX_09;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  extraout_RDX_10;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  extraout_RDX_11;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  extraout_RDX_12;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  _Var18;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  extraout_RDX_13;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  extraout_RDX_14;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  extraout_RDX_15;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  extraout_RDX_16;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  _Var19;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  _Var20;
  __node_type *extraout_RDX_17;
  __node_type *extraout_RDX_18;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var21;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  res_it;
  Char **Args_4_00;
  char *in_R8;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  pVar25;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  pVar26;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  pVar27;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  pVar28;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar29;
  char (*in_stack_fffffffffffffe38) [152];
  string msg_3;
  String AssignedSamplerName;
  string msg;
  __node_base_ptr ap_Stack_128 [2];
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
  ImtblSamplers;
  bool local_d0;
  bool local_cc;
  char *local_c8;
  String local_c0;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  AssignedImtblSamplers;
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
  Resources;
  RENDER_DEVICE_TYPE *pRVar7;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  _Var8;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  _Var9;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  _Var14;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  _Var16;
  
  if (pDevice == (IRenderDevice *)0x0) {
    local_cc = false;
    local_d0 = false;
    bVar24 = false;
    bVar23 = false;
  }
  else {
    iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    pRVar7 = (RENDER_DEVICE_TYPE *)CONCAT44(extraout_var,iVar5);
    bVar23 = (char)pRVar7[3] == RENDER_DEVICE_TYPE_UNDEFINED;
    local_cc = *(byte *)((long)pRVar7 + 0x3a) == 0;
    DeviceType = *pRVar7;
    local_d0 = *(byte *)((long)pRVar7 + 0x2d) == 0;
    in_RCX = (ImmutableSamplerDesc *)CONCAT71((int7)((ulong)in_RCX >> 8),local_d0);
    bVar24 = (char)pRVar7[5] == RENDER_DEVICE_TYPE_UNDEFINED;
  }
  if (7 < Desc->BindingIndex) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,(uint)Desc->BindingIndex);
    msg._M_dataplus._M_p._0_4_ = 7;
    in_R8 = "Description of a pipeline resource signature \'";
    in_RCX = (ImmutableSamplerDesc *)0x33;
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x33,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.BindingIndex (",(uint *)&ImtblSamplers,
               (char (*) [38])") exceeds the maximum allowed value (",(uint *)&msg,
               (char (*) [3])0x930cd5);
  }
  if (0xffff < Desc->NumResources) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,Desc->NumResources);
    in_R8 = "Description of a pipeline resource signature \'";
    in_RCX = (ImmutableSamplerDesc *)0x36;
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x36,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",(uint *)&ImtblSamplers,
               (char (*) [38])") exceeds the maximum allowed value (",&MAX_RESOURCES_IN_SIGNATURE,
               (char (*) [3])0x930cd5);
  }
  if ((Desc->NumResources != 0) && (Desc->Resources == (PipelineResourceDesc *)0x0)) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,Desc->NumResources);
    in_R8 = "Description of a pipeline resource signature \'";
    in_RCX = (ImmutableSamplerDesc *)0x39;
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[43]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x39,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",(uint *)&ImtblSamplers,
               (char (*) [43])") is not zero, but Desc.Resources is null.");
  }
  if ((Desc->NumImmutableSamplers != 0) && (Desc->ImmutableSamplers == (ImmutableSamplerDesc *)0x0))
  {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,Desc->NumImmutableSamplers);
    in_R8 = "Description of a pipeline resource signature \'";
    in_RCX = (ImmutableSamplerDesc *)0x3c;
    LogError<true,char[47],char_const*,char[15],char[28],unsigned_int,char[51]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3c,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [28])"Desc.NumImmutableSamplers (",(uint *)&ImtblSamplers,
               (char (*) [51])") is not zero, but Desc.ImmutableSamplers is null.");
  }
  if ((Desc->UseCombinedTextureSamplers == true) &&
     ((Desc->CombinedSamplerSuffix == (char *)0x0 || (*Desc->CombinedSamplerSuffix == '\0')))) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    }
    in_R8 = "Description of a pipeline resource signature \'";
    in_RCX = (ImmutableSamplerDesc *)0x3f;
    LogError<true,char[47],char_const*,char[15],char[89]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3f,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty"
              );
  }
  Resources._M_h._M_buckets = &Resources._M_h._M_single_bucket;
  Resources._M_h._M_bucket_count = 1;
  Resources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Resources._M_h._M_element_count = 0;
  Resources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Resources._M_h._M_rehash_policy._M_next_resize = 0;
  Resources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  msg_3._M_dataplus._M_p = (pointer)((ulong)msg_3._M_dataplus._M_p._4_4_ << 0x20);
  if (Desc->NumResources != 0) {
    uVar6 = 0;
    do {
      pPVar1 = Desc->Resources;
      if (pPVar1[uVar6].Name == (Char *)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[25]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x49,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,(char (*) [25])"].Name must not be null.");
      }
      in_RCX = (ImmutableSamplerDesc *)(pPVar1 + uVar6);
      if (**(char **)in_RCX == '\0') {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[26]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x4c,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,(char (*) [26])"].Name must not be empty.");
      }
      if (*(SHADER_TYPE *)&in_RCX->SamplerOrTextureName == SHADER_TYPE_UNKNOWN) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[48]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x4f,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,(char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
      }
      if (*(Uint32 *)((long)&in_RCX->SamplerOrTextureName + 4) == 0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[27]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x52,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,(char (*) [27])"].ArraySize must not be 0.");
      }
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&ImtblSamplers,*(Char **)in_RCX,false);
      pVar25 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(&Resources._M_h,(key_type *)&ImtblSamplers);
      _Var14 = pVar25.second.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
               ._M_cur;
      _Var8 = pVar25.first.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
              ._M_cur;
      if ((ImtblSamplers._M_h._M_buckets != (__buckets_ptr)0x0) &&
         ((long)ImtblSamplers._M_h._M_bucket_count < 0)) {
        operator_delete__(ImtblSamplers._M_h._M_buckets);
        pVar25.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ._M_cur = extraout_RDX.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                  ._M_cur;
        pVar25.first.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ._M_cur = _Var8.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                  ._M_cur;
      }
      while( true ) {
        _Var15._M_cur =
             (__node_type *)
             pVar25.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             ._M_cur;
        _Var18._M_cur =
             (__node_type *)
             pVar25.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             ._M_cur;
        if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             )_Var18._M_cur ==
            _Var14.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur) break;
        pacVar13 = (char (*) [51])(ulong)*(SHADER_TYPE *)&in_RCX->SamplerOrTextureName;
        if ((*(SHADER_TYPE *)
              (*(long *)((long)&((_Var18._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                                ._M_storage._M_storage + 0x10) + 8) &
            *(SHADER_TYPE *)&in_RCX->SamplerOrTextureName) != SHADER_TYPE_UNKNOWN) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
          if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
            ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
          }
          pacVar13 = (char (*) [51])0x5b;
          in_R8 = "Description of a pipeline resource signature \'";
          LogError<true,char[47],char_const*,char[15],char[31],char_const*,char[149]>
                    (false,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x5b,(char (*) [47])"Description of a pipeline resource signature \'",
                     (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                     (char (*) [31])"Multiple resources with name \'",(char **)in_RCX,
                     (char (*) [149])
                     "\' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, but the stages must not overlap."
                    );
          _Var15._M_cur = extraout_RDX_00;
        }
        SVar12 = (SHADER_TYPE)_Var15._M_cur;
        if (bVar23) {
          if (*(int *)(*(long *)((long)&((_Var18._M_cur)->
                                        super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                                        ._M_storage._M_storage + 0x10) + 8) == 0) {
            FormatString<char[26],char[51]>
                      ((string *)&ImtblSamplers,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",pacVar13)
            ;
            DebugAssertionFailed
                      ((Char *)ImtblSamplers._M_h._M_buckets,"ValidatePipelineResourceSignatureDesc"
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0x60);
            SVar12 = extraout_EDX;
            if ((__node_base *)ImtblSamplers._M_h._M_buckets != &ImtblSamplers._M_h._M_before_begin)
            {
              operator_delete(ImtblSamplers._M_h._M_buckets,
                              (ulong)((long)&(ImtblSamplers._M_h._M_before_begin._M_nxt)->_M_nxt + 1
                                     ));
              SVar12 = extraout_EDX_00;
            }
          }
          AssignedImtblSamplers._M_h._M_buckets =
               (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
          if (AssignedImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
            AssignedImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
          }
          GetShaderStagesString_abi_cxx11_
                    ((string *)&ImtblSamplers,
                     (Diligent *)(ulong)*(SHADER_TYPE *)&in_RCX->SamplerOrTextureName,SVar12);
          GetShaderStagesString_abi_cxx11_
                    (&msg,(Diligent *)
                          (ulong)*(uint *)(*(long *)((long)&((_Var18._M_cur)->
                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                                                  ._M_storage._M_storage + 0x10) + 8),ShaderStages);
          in_R8 = "Description of a pipeline resource signature \'";
          LogError<true,char[47],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                    (false,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x66,(char (*) [47])"Description of a pipeline resource signature \'",
                     (char **)&AssignedImtblSamplers,(char (*) [15])"\' is invalid: ",
                     (char (*) [98])
                     "This device does not support separable programs, but there are separate resources with the name \'"
                     ,(char **)in_RCX,(char (*) [20])"\' in shader stages ",(string *)&ImtblSamplers
                     ,(char (*) [6])0x90f9ba,&msg,(char (*) [184])0x91dc95);
          _Var15._M_cur = extraout_RDX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            _Var15._M_cur = extraout_RDX_02;
          }
          if ((__node_base *)ImtblSamplers._M_h._M_buckets != &ImtblSamplers._M_h._M_before_begin) {
            operator_delete(ImtblSamplers._M_h._M_buckets,
                            (ulong)((long)&(ImtblSamplers._M_h._M_before_begin._M_nxt)->_M_nxt + 1))
            ;
            _Var15._M_cur = extraout_RDX_03._M_cur;
          }
        }
        pVar25.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                   )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                     )_Var15._M_cur;
        pVar25.first.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                   )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                     )((_Var18._M_cur)->super__Hash_node_base)._M_nxt;
      }
      PVar4 = GetValidPipelineResourceFlags
                        (*(SHADER_RESOURCE_TYPE *)&(in_RCX->Desc).super_DeviceObjectAttribs.Name);
      SVar12 = extraout_EDX_01;
      if ((*(PIPELINE_RESOURCE_FLAGS *)((long)&(in_RCX->Desc).super_DeviceObjectAttribs.Name + 2) &
          ~PVar4) != PIPELINE_RESOURCE_FLAG_NONE) {
        AssignedImtblSamplers._M_h._M_buckets =
             (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (AssignedImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          AssignedImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        GetPipelineResourceFlagsString_abi_cxx11_
                  ((string *)&ImtblSamplers,
                   (Diligent *)
                   (ulong)*(PIPELINE_RESOURCE_FLAGS *)
                           ((long)&(in_RCX->Desc).super_DeviceObjectAttribs.Name + 2),
                   PIPELINE_RESOURCE_FLAG_NONE,true,in_R8);
        AssignedSamplerName._M_dataplus._M_p =
             GetShaderResourceTypeLiteralName
                       (*(SHADER_RESOURCE_TYPE *)&(in_RCX->Desc).super_DeviceObjectAttribs.Name,
                        false);
        GetPipelineResourceFlagsString_abi_cxx11_
                  (&msg,(Diligent *)(ulong)PVar4,PIPELINE_RESOURCE_FLAG_NONE,true,in_R8);
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[10],std::__cxx11::string,char[45],char_const*,char[3],std::__cxx11::string,char[2]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x6f,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&AssignedImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                   (char (*) [10])"].Flags (",(string *)&ImtblSamplers,
                   (char (*) [45])"). Only the following flags are valid for a ",
                   (char **)&AssignedSamplerName,(char (*) [3])0x899fd6,&msg,(char (*) [2])0x91f766)
        ;
        SVar12 = extraout_EDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          SVar12 = extraout_EDX_03;
        }
        if ((__node_base *)ImtblSamplers._M_h._M_buckets != &ImtblSamplers._M_h._M_before_begin) {
          operator_delete(ImtblSamplers._M_h._M_buckets,
                          (ulong)((long)&(ImtblSamplers._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
          SVar12 = extraout_EDX_04;
        }
      }
      if (((*(PIPELINE_RESOURCE_FLAGS *)((long)&(in_RCX->Desc).super_DeviceObjectAttribs.Name + 2) &
           PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) >> 2 & local_cc) == 1) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[101]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x74,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                   (char (*) [101])
                   "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled."
                  );
        SVar12 = extraout_EDX_05;
      }
      if (((*(PIPELINE_RESOURCE_FLAGS *)((long)&(in_RCX->Desc).super_DeviceObjectAttribs.Name + 2) &
           PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) >> 3 & local_d0) == 1) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[109]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x79,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                   (char (*) [109])
                   "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled."
                  );
        SVar12 = extraout_EDX_06;
      }
      if ((bool)(*(SHADER_RESOURCE_TYPE *)&(in_RCX->Desc).super_DeviceObjectAttribs.Name ==
                 SHADER_RESOURCE_TYPE_ACCEL_STRUCT & bVar24)) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[71]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x7e,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                   (char (*) [71])
                   "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
        SVar12 = extraout_EDX_07;
      }
      if ((*(SHADER_RESOURCE_TYPE *)&(in_RCX->Desc).super_DeviceObjectAttribs.Name ==
           SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT) &&
         (*(SHADER_TYPE *)&in_RCX->SamplerOrTextureName != SHADER_TYPE_PIXEL)) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        GetShaderStagesString_abi_cxx11_
                  ((string *)&ImtblSamplers,
                   (Diligent *)(ulong)*(SHADER_TYPE *)&in_RCX->SamplerOrTextureName,SVar12);
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[90],std::__cxx11::string,char[2]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x83,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&msg,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,
                   (char (*) [90])
                   "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are "
                   ,(string *)&ImtblSamplers,(char (*) [2])0x91f766);
        if ((__node_base *)ImtblSamplers._M_h._M_buckets != &ImtblSamplers._M_h._M_before_begin) {
          operator_delete(ImtblSamplers._M_h._M_buckets,
                          (ulong)((long)&(ImtblSamplers._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
        }
      }
      if ((((DeviceType < RENDER_DEVICE_TYPE_WEBGPU) && ((0x46U >> (DeviceType & 0x1f) & 1) != 0))
          && (((ulong)(in_RCX->Desc).super_DeviceObjectAttribs.Name & 0x20000) != 0)) &&
         (Desc->UseCombinedTextureSamplers == false)) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[197]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x8c,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,
                   (char (*) [197])
                   "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true."
                  );
      }
      if (((ulong)(in_RCX->Desc).super_DeviceObjectAttribs.Name & 0x100000) != 0 &&
          (DeviceType != RENDER_DEVICE_TYPE_VULKAN && DeviceType != RENDER_DEVICE_TYPE_UNDEFINED)) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        }
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[71]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x94,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x91bf5e,
                   (uint *)&msg_3,
                   (char (*) [71])
                   "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
      }
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<char_const*const&,Diligent::PipelineResourceDesc_const&>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&Resources,0,in_RCX);
      uVar6 = (uint)msg_3._M_dataplus._M_p + 1;
      msg_3._M_dataplus._M_p._0_4_ = uVar6;
    } while (uVar6 < Desc->NumResources);
  }
  ImtblSamplers._M_h._M_buckets = &ImtblSamplers._M_h._M_single_bucket;
  ImtblSamplers._M_h._M_bucket_count = 1;
  ImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ImtblSamplers._M_h._M_element_count = 0;
  ImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
  ImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  msg_3._M_dataplus._M_p = msg_3._M_dataplus._M_p & 0xffffffff00000000;
  if (Desc->NumImmutableSamplers != 0) {
    uVar6 = 0;
    do {
      pIVar2 = Desc->ImmutableSamplers;
      if (pIVar2[uVar6].SamplerOrTextureName == (Char *)0x0) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[41]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xab,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&msg,(char (*) [15])"\' is invalid: ",
                   (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                   (char (*) [41])"].SamplerOrTextureName must not be null.");
      }
      Args_4_00 = &pIVar2[uVar6].SamplerOrTextureName;
      if (**Args_4_00 == '\0') {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[42]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xae,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&msg,(char (*) [15])"\' is invalid: ",
                   (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                   (char (*) [42])"].SamplerOrTextureName must not be empty.");
      }
      in_RCX = pIVar2 + uVar6;
      if (in_RCX->ShaderStages == 0) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[48]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xb1,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&msg,(char (*) [15])"\' is invalid: ",
                   (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                   (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
      }
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*Args_4_00,false);
      pVar26 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(&ImtblSamplers._M_h,(key_type *)&msg);
      _Var16 = pVar26.second.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
               ._M_cur;
      _Var9 = pVar26.first.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
              ._M_cur;
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
        pVar26.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ._M_cur = extraout_RDX_04.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                  ._M_cur;
        pVar26.first.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ._M_cur = _Var9.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                  ._M_cur;
      }
      while( true ) {
        _Var17._M_cur =
             (__node_type *)
             pVar26.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             ._M_cur;
        _Var19._M_cur =
             (__node_type *)
             pVar26.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             ._M_cur;
        if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             )_Var19._M_cur ==
            _Var16.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur) break;
        pacVar13 = (char (*) [51])(ulong)in_RCX->ShaderStages;
        if ((**(uint **)((long)&((_Var19._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                                ._M_storage._M_storage + 0x10) & in_RCX->ShaderStages) != 0) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          pacVar13 = (char (*) [51])0xba;
          LogError<true,char[47],char_const*,char[15],char[40],char_const*,char[158]>
                    (false,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0xba,(char (*) [47])"Description of a pipeline resource signature \'",
                     (char **)&msg,(char (*) [15])"\' is invalid: ",
                     (char (*) [40])"Multiple immutable samplers with name \'",Args_4_00,
                     (char (*) [158])
                     "\' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, but the stages must not overlap."
                    );
          _Var17._M_cur = extraout_RDX_05;
        }
        SVar12 = (SHADER_TYPE)_Var17._M_cur;
        if (bVar23) {
          if (**(int **)((long)&((_Var19._M_cur)->
                                super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                                ._M_storage._M_storage + 0x10) == 0) {
            FormatString<char[26],char[51]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",pacVar13)
            ;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0xbe);
            SVar12 = extraout_EDX_08;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              SVar12 = extraout_EDX_09;
            }
          }
          AssignedSamplerName._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (AssignedSamplerName._M_dataplus._M_p == (char *)0x0) {
            AssignedSamplerName._M_dataplus._M_p = "";
          }
          GetShaderStagesString_abi_cxx11_(&msg,(Diligent *)(ulong)in_RCX->ShaderStages,SVar12);
          GetShaderStagesString_abi_cxx11_
                    ((String *)&AssignedImtblSamplers,
                     (Diligent *)
                     (ulong)**(uint **)((long)&((_Var19._M_cur)->
                                               super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                               ).
                                               super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                                               ._M_storage._M_storage + 0x10),ShaderStages_00);
          LogError<true,char[47],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                    (false,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0xc4,(char (*) [47])"Description of a pipeline resource signature \'",
                     (char **)&AssignedSamplerName,(char (*) [15])"\' is invalid: ",
                     (char (*) [107])
                     "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                     ,Args_4_00,(char (*) [20])"\' in shader stages ",&msg,(char (*) [6])0x90f9ba,
                     (String *)&AssignedImtblSamplers,
                     (char (*) [192])
                     ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                    );
          _Var17._M_cur = extraout_RDX_06;
          if ((__node_base *)AssignedImtblSamplers._M_h._M_buckets !=
              &AssignedImtblSamplers._M_h._M_before_begin) {
            operator_delete(AssignedImtblSamplers._M_h._M_buckets,
                            (ulong)((long)&(AssignedImtblSamplers._M_h._M_before_begin._M_nxt)->
                                           _M_nxt + 1));
            _Var17._M_cur = extraout_RDX_07;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            _Var17._M_cur = extraout_RDX_08._M_cur;
          }
        }
        pVar26.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                   )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                     )_Var17._M_cur;
        pVar26.first.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                   )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                     )((_Var19._M_cur)->super__Hash_node_base)._M_nxt;
      }
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<char_const*const&,Diligent::ImmutableSamplerDesc_const&>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&ImtblSamplers,0,Args_4_00);
      uVar6 = (uint)msg_3._M_dataplus._M_p + 1;
      msg_3._M_dataplus._M_p._0_4_ = uVar6;
    } while (uVar6 < Desc->NumImmutableSamplers);
  }
  if (Desc->UseCombinedTextureSamplers != false) {
    if (Desc->CombinedSamplerSuffix == (Char *)0x0) {
      FormatString<char[26],char[38]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Desc.CombinedSamplerSuffix != nullptr",(char (*) [38])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xcd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    msg._M_dataplus._M_p = (pointer)ap_Stack_128;
    msg._M_string_length = 1;
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    ap_Stack_128[0] = (__node_base_ptr)0x0;
    AssignedImtblSamplers._M_h._M_buckets = &AssignedImtblSamplers._M_h._M_single_bucket;
    AssignedImtblSamplers._M_h._M_bucket_count = 1;
    AssignedImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AssignedImtblSamplers._M_h._M_element_count = 0;
    AssignedImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AssignedImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
    AssignedImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (Desc->NumResources != 0) {
      uVar22 = 0;
      do {
        if (Desc->Resources[uVar22].ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
          pPVar1 = Desc->Resources + uVar22;
          std::__cxx11::string::string((string *)&msg_3,pPVar1->Name,(allocator *)&local_c0);
          plVar10 = (long *)std::__cxx11::string::append((char *)&msg_3);
          AssignedSamplerName._M_dataplus._M_p = (pointer)&AssignedSamplerName.field_2;
          Args_1 = (char (*) [48])(plVar10 + 2);
          if ((char (*) [48])*plVar10 == Args_1) {
            AssignedSamplerName.field_2._M_allocated_capacity = *(undefined8 *)*Args_1;
            AssignedSamplerName.field_2._8_8_ = plVar10[3];
          }
          else {
            AssignedSamplerName.field_2._M_allocated_capacity = *(undefined8 *)*Args_1;
            AssignedSamplerName._M_dataplus._M_p = (pointer)*plVar10;
          }
          AssignedSamplerName._M_string_length = plVar10[1];
          *plVar10 = (long)Args_1;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
            operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
          }
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg_3,AssignedSamplerName._M_dataplus._M_p,false);
          pVar27 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&Resources._M_h,(key_type *)&msg_3);
          _Var14 = pVar27.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                   ._M_cur;
          _Var8 = pVar27.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                  ._M_cur;
          if ((msg_3._M_dataplus._M_p != (pointer)0x0) && ((long)msg_3._M_string_length < 0)) {
            operator_delete__(msg_3._M_dataplus._M_p);
            pVar27.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur = extraout_RDX_09.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                      ._M_cur;
            pVar27.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur = _Var8.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                      ._M_cur;
          }
          while (_Var15._M_cur =
                      (__node_type *)
                      pVar27.first.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                      ._M_cur,
                (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                 )_Var15._M_cur !=
                _Var14.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                ._M_cur) {
            Args_4 = *(char ***)
                      ((long)&((_Var15._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                              ._M_storage._M_storage + 0x10);
            iVar5 = std::__cxx11::string::compare((char *)&AssignedSamplerName);
            _Var18._M_cur = extraout_RDX_10._M_cur;
            if (iVar5 != 0) {
              FormatString<char[26],char[32]>
                        (&msg_3,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"AssignedSamplerName == Sam.Name",(char (*) [32])Args_1);
              Args_1 = (char (*) [48])0xe3;
              DebugAssertionFailed
                        (msg_3._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xe3);
              _Var18._M_cur = extraout_RDX_11._M_cur;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
                operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
                _Var18._M_cur = extraout_RDX_12._M_cur;
              }
            }
            SVar12 = (SHADER_TYPE)_Var18._M_cur;
            if ((*(SHADER_TYPE *)(Args_4 + 1) & pPVar1->ShaderStages) != SHADER_TYPE_UNKNOWN) {
              if (*(char *)(Args_4 + 2) != '\x06') {
                msg_3._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg_3._M_dataplus._M_p == (char *)0x0) {
                  msg_3._M_dataplus._M_p = "";
                }
                LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[26],char_const*,char[20]>
                          (false,"ValidatePipelineResourceSignatureDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                           ,0xe9,(char (*) [47])"Description of a pipeline resource signature \'",
                           (char **)&msg_3,(char (*) [15])"\' is invalid: ",
                           (char (*) [11])"Resource \'",Args_4,
                           (char (*) [26])"\' combined with texture \'",&pPVar1->Name,
                           (char (*) [20])"\' is not a sampler.");
                SVar12 = extraout_EDX_10;
              }
              Args_1 = (char (*) [48])(Args_4 + 1);
              if ((pPVar1->ShaderStages & ~*(uint *)*Args_1) != SHADER_TYPE_UNKNOWN) {
                local_c8 = (Desc->super_DeviceObjectAttribs).Name;
                if (local_c8 == (char *)0x0) {
                  local_c8 = "";
                }
                GetShaderStagesString_abi_cxx11_
                          (&msg_3,(Diligent *)(ulong)pPVar1->ShaderStages,SVar12);
                GetShaderStagesString_abi_cxx11_
                          (&local_c0,(Diligent *)(ulong)*(uint *)*Args_1,ShaderStages_01);
                LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[16],char_const*,char[50],std::__cxx11::string,char[231]>
                          (false,"ValidatePipelineResourceSignatureDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                           ,0xf1,(char (*) [47])"Description of a pipeline resource signature \'",
                           &local_c8,(char (*) [15])"\' is invalid: ",(char (*) [10])0x91805f,
                           &pPVar1->Name,
                           (char (*) [47])"\' is defined for the following shader stages: ",&msg_3,
                           (char (*) [16])", but sampler \'",Args_4,
                           (char (*) [50])"\' assigned to it uses only some of these stages: ",
                           &local_c0,
                           (char (*) [231])
                           ". A resource that is present in multiple shader stages can\'t be combined with different samplers in different stages. Either use separate resources for different stages, or define the sampler for all stages that the resource uses."
                          );
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
                  operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
                }
              }
              if (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)Args_4 + 0x11) != pPVar1->VarType) {
                msg_3._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg_3._M_dataplus._M_p == (char *)0x0) {
                  msg_3._M_dataplus._M_p = "";
                }
                local_c0._M_dataplus._M_p = GetShaderVariableTypeLiteralName(pPVar1->VarType,false);
                local_c8 = GetShaderVariableTypeLiteralName
                                     (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)Args_4 + 0x11),false)
                ;
                LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[24],char_const*,char[28],char_const*,char[15],char_const*,char[26]>
                          (false,"ValidatePipelineResourceSignatureDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                           ,0xf8,(char (*) [47])"Description of a pipeline resource signature \'",
                           (char **)&msg_3,(char (*) [15])"\' is invalid: ",
                           (char (*) [11])"The type (",(char **)&local_c0,
                           (char (*) [24])") of texture resource \'",&pPVar1->Name,
                           (char (*) [28])"\' does not match the type (",&local_c8,
                           (char (*) [15])") of sampler \'",Args_4,
                           (char (*) [26])"\' that is assigned to it.");
              }
              std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                        ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                          *)&msg,0,Args_4);
              break;
            }
            pVar27.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                         )_Var18._M_cur;
            pVar27.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                         )((_Var15._M_cur)->super__Hash_node_base)._M_nxt;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)AssignedSamplerName._M_dataplus._M_p != &AssignedSamplerName.field_2) {
            operator_delete(AssignedSamplerName._M_dataplus._M_p,
                            AssignedSamplerName.field_2._M_allocated_capacity + 1);
          }
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&AssignedSamplerName,pPVar1->Name,false);
          pVar28 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&ImtblSamplers._M_h,(key_type *)&AssignedSamplerName);
          _Var16 = pVar28.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                   ._M_cur;
          _Var9 = pVar28.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                  ._M_cur;
          if ((AssignedSamplerName._M_dataplus._M_p != (pointer)0x0) &&
             ((long)AssignedSamplerName._M_string_length < 0)) {
            operator_delete__(AssignedSamplerName._M_dataplus._M_p);
            pVar28.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur = extraout_RDX_13.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                      ._M_cur;
            pVar28.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur = _Var9.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                      ._M_cur;
          }
          while (_Var17._M_cur =
                      (__node_type *)
                      pVar28.first.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                      ._M_cur,
                (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                 )_Var17._M_cur !=
                _Var16.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                ._M_cur) {
            pSVar3 = *(SHADER_TYPE **)
                      ((long)&((_Var17._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                              ._M_storage._M_storage + 0x10);
            iVar5 = strcmp(*(char **)(pSVar3 + 2),pPVar1->Name);
            _Var19._M_cur = extraout_RDX_14._M_cur;
            if (iVar5 != 0) {
              FormatString<char[26],char[48]>
                        (&AssignedSamplerName,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"strcmp(Sam.SamplerOrTextureName, Res.Name) == 0",Args_1);
              DebugAssertionFailed
                        (AssignedSamplerName._M_dataplus._M_p,
                         "ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0x107);
              _Var19._M_cur = extraout_RDX_15._M_cur;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)AssignedSamplerName._M_dataplus._M_p != &AssignedSamplerName.field_2) {
                operator_delete(AssignedSamplerName._M_dataplus._M_p,
                                AssignedSamplerName.field_2._M_allocated_capacity + 1);
                _Var19._M_cur = extraout_RDX_16._M_cur;
              }
            }
            SVar12 = *pSVar3 & pPVar1->ShaderStages;
            Args_1 = (char (*) [48])(ulong)SVar12;
            if (SVar12 != SHADER_TYPE_UNKNOWN) {
              if (SVar12 != pPVar1->ShaderStages) {
                local_c0._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (local_c0._M_dataplus._M_p == (char *)0x0) {
                  local_c0._M_dataplus._M_p = "";
                }
                GetShaderStagesString_abi_cxx11_
                          (&AssignedSamplerName,(Diligent *)(ulong)pPVar1->ShaderStages,
                           (SHADER_TYPE)_Var19._M_cur);
                GetShaderStagesString_abi_cxx11_(&msg_3,(Diligent *)(ulong)*pSVar3,ShaderStages_02);
                LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[80],std::__cxx11::string,char[250]>
                          (false,"ValidatePipelineResourceSignatureDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                           ,0x110,(char (*) [47])"Description of a pipeline resource signature \'",
                           (char **)&local_c0,(char (*) [15])"\' is invalid: ",
                           (char (*) [10])0x91805f,&pPVar1->Name,
                           (char (*) [47])"\' is defined for the following shader stages: ",
                           &AssignedSamplerName,
                           (char (*) [80])
                           ", but immutable sampler that is assigned to it uses only some of these stages: "
                           ,&msg_3,(char (*) [250])
                                   ". A resource that is present in multiple shader stages can\'t be combined with different immutable samples in different stages. Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses."
                          );
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
                  operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)AssignedSamplerName._M_dataplus._M_p != &AssignedSamplerName.field_2) {
                  operator_delete(AssignedSamplerName._M_dataplus._M_p,
                                  AssignedSamplerName.field_2._M_allocated_capacity + 1);
                }
              }
              std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                        ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                          *)&AssignedImtblSamplers,0,pSVar3 + 2,pSVar3);
              break;
            }
            pVar28.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                         )_Var19._M_cur;
            pVar28.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                         )((_Var17._M_cur)->super__Hash_node_base)._M_nxt;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < Desc->NumResources);
    }
    if (Desc->NumResources != 0) {
      uVar22 = 0;
      do {
        if (Desc->Resources[uVar22].ResourceType == SHADER_RESOURCE_TYPE_SAMPLER) {
          pPVar1 = Desc->Resources + uVar22;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&AssignedSamplerName,pPVar1->Name,false);
          pVar29 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                                  *)&msg,(key_type *)&AssignedSamplerName);
          _Var20 = pVar29.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                   ._M_cur;
          _Var11._M_cur =
               (__node_type *)
               pVar29.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               ._M_cur;
          _Var21 = _Var20.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                   ._M_cur;
          if ((AssignedSamplerName._M_dataplus._M_p != (pointer)0x0) &&
             ((long)AssignedSamplerName._M_string_length < 0)) {
            operator_delete__(AssignedSamplerName._M_dataplus._M_p);
            _Var21._M_cur = extraout_RDX_17;
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               )_Var11._M_cur !=
              _Var20.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              ._M_cur) {
            do {
              if (*(SHADER_TYPE *)
                   ((long)&((_Var11._M_cur)->
                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                           ._M_storage._M_storage + 0x10) == pPVar1->ShaderStages) break;
              _Var11._M_cur = (__node_type *)((_Var11._M_cur)->super__Hash_node_base)._M_nxt;
            } while ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                      )_Var11._M_cur !=
                     _Var20.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                     ._M_cur);
          }
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               )_Var11._M_cur ==
              _Var20.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              ._M_cur) {
            GetShaderStagesString_abi_cxx11_
                      (&msg_3,(Diligent *)(ulong)pPVar1->ShaderStages,(SHADER_TYPE)_Var21._M_cur);
            FormatString<char[10],char_const*,char[4],std::__cxx11::string,char[120]>
                      (&AssignedSamplerName,(Diligent *)"Sampler \'",(char (*) [10])pPVar1,
                       (char **)"\' (",(char (*) [4])&msg_3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ")\' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used."
                       ,(char (*) [120])in_stack_fffffffffffffe38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
              operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,AssignedSamplerName._M_dataplus._M_p,0,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)AssignedSamplerName._M_dataplus._M_p != &AssignedSamplerName.field_2) {
              operator_delete(AssignedSamplerName._M_dataplus._M_p,
                              AssignedSamplerName.field_2._M_allocated_capacity + 1);
            }
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < Desc->NumResources);
    }
    if (Desc->NumImmutableSamplers != 0) {
      uVar22 = 0;
      do {
        pIVar2 = Desc->ImmutableSamplers;
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&AssignedSamplerName,pIVar2[uVar22].SamplerOrTextureName,
                   false);
        pVar29 = std::
                 _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&AssignedImtblSamplers._M_h,(key_type *)&AssignedSamplerName);
        _Var20 = pVar29.second.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 ._M_cur;
        _Var11._M_cur =
             (__node_type *)
             pVar29.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ._M_cur;
        _Var21 = _Var20.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 ._M_cur;
        if ((AssignedSamplerName._M_dataplus._M_p != (pointer)0x0) &&
           ((long)AssignedSamplerName._M_string_length < 0)) {
          operator_delete__(AssignedSamplerName._M_dataplus._M_p);
          _Var21._M_cur = extraout_RDX_18;
        }
        if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             )_Var11._M_cur !=
            _Var20.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ._M_cur) {
          do {
            if (*(SHADER_TYPE *)
                 ((long)&((_Var11._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                         ._M_storage._M_storage + 0x10) == pIVar2[uVar22].ShaderStages) break;
            _Var11._M_cur = (__node_type *)((_Var11._M_cur)->super__Hash_node_base)._M_nxt;
          } while ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                    )_Var11._M_cur !=
                   _Var20.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                   ._M_cur);
        }
        if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             )_Var11._M_cur ==
            _Var20.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ._M_cur) {
          GetShaderStagesString_abi_cxx11_
                    (&msg_3,(Diligent *)(ulong)pIVar2[uVar22].ShaderStages,
                     (SHADER_TYPE)_Var21._M_cur);
          FormatString<char[20],char_const*,char[4],std::__cxx11::string,char[152]>
                    (&AssignedSamplerName,(Diligent *)"Immutable sampler \'",
                     (char (*) [20])&pIVar2[uVar22].SamplerOrTextureName,(char **)"\' (",
                     (char (*) [4])&msg_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used."
                     ,in_stack_fffffffffffffe38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_3._M_dataplus._M_p != &msg_3.field_2) {
            operator_delete(msg_3._M_dataplus._M_p,msg_3.field_2._M_allocated_capacity + 1);
          }
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,AssignedSamplerName._M_dataplus._M_p,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)AssignedSamplerName._M_dataplus._M_p != &AssignedSamplerName.field_2) {
            operator_delete(AssignedSamplerName._M_dataplus._M_p,
                            AssignedSamplerName.field_2._M_allocated_capacity + 1);
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < Desc->NumImmutableSamplers);
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&AssignedImtblSamplers._M_h);
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   *)&msg);
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&ImtblSamplers._M_h);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&Resources._M_h);
  return;
}

Assistant:

void ValidatePipelineResourceSignatureDesc(const PipelineResourceSignatureDesc& Desc,
                                           const IRenderDevice*                 pDevice,
                                           RENDER_DEVICE_TYPE                   DeviceType) noexcept(false)
{
    const RenderDeviceInfo& DeviceInfo = pDevice != nullptr ?
        pDevice->GetDeviceInfo() :
        RenderDeviceInfo{DeviceType, Version{}, DeviceFeatures{DEVICE_FEATURE_STATE_ENABLED}};

    const DeviceFeatures& Features = DeviceInfo.Features;

    if (Desc.BindingIndex >= MAX_RESOURCE_SIGNATURES)
        LOG_PRS_ERROR_AND_THROW("Desc.BindingIndex (", Uint32{Desc.BindingIndex}, ") exceeds the maximum allowed value (", MAX_RESOURCE_SIGNATURES - 1, ").");

    if (Desc.NumResources > MAX_RESOURCES_IN_SIGNATURE)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") exceeds the maximum allowed value (", MAX_RESOURCES_IN_SIGNATURE, ").");

    if (Desc.NumResources != 0 && Desc.Resources == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") is not zero, but Desc.Resources is null.");

    if (Desc.NumImmutableSamplers != 0 && Desc.ImmutableSamplers == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumImmutableSamplers (", Uint32{Desc.NumImmutableSamplers}, ") is not zero, but Desc.ImmutableSamplers is null.");

    if (Desc.UseCombinedTextureSamplers && (Desc.CombinedSamplerSuffix == nullptr || Desc.CombinedSamplerSuffix[0] == '\0'))
        LOG_PRS_ERROR_AND_THROW("Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty");


    // Hash map of all resources by name
    std::unordered_multimap<HashMapStringKey, const PipelineResourceDesc&> Resources;
    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        if (Res.Name == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be null.");

        if (Res.Name[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be empty.");

        if (Res.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        if (Res.ArraySize == 0)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ArraySize must not be 0.");

        const auto res_range = Resources.equal_range(Res.Name);
        for (auto res_it = res_range.first; res_it != res_range.second; ++res_it)
        {
            if ((res_it->second.ShaderStages & Res.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple resources with name '", Res.Name,
                                        "' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }

            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                        Res.Name, "' in shader stages ",
                                        GetShaderStagesString(Res.ShaderStages), " and ",
                                        GetShaderStagesString(res_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct resource names for each stage or define a single resource for all stages.");
            }
        }

        PIPELINE_RESOURCE_FLAGS AllowedResourceFlags = GetValidPipelineResourceFlags(Res.ResourceType);
        if ((Res.Flags & ~AllowedResourceFlags) != 0)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (", GetPipelineResourceFlagsString(Res.Flags),
                                    "). Only the following flags are valid for a ", GetShaderResourceTypeLiteralName(Res.ResourceType),
                                    ": ", GetPipelineResourceFlagsString(AllowedResourceFlags, false, ", "), ".");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0 && Features.FormattedBuffers == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled.");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0 && Features.ShaderResourceRuntimeArrays == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_ACCEL_STRUCT && Features.RayTracing == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT && Res.ShaderStages != SHADER_TYPE_PIXEL)
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are ", GetShaderStagesString(Res.ShaderStages), ".");
        }

        if (DeviceInfo.IsD3DDevice() || DeviceInfo.IsMetalDevice())
        {
            if ((Res.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != 0 && !Desc.UseCombinedTextureSamplers)
            {
                LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i,
                                        "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. "
                                        "In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true.");
            }
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT) != 0 &&
            DeviceInfo.Type != RENDER_DEVICE_TYPE_UNDEFINED && // May be UNDEFINED for serialized signature
            !DeviceInfo.IsVulkanDevice())
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
        }

        Resources.emplace(Res.Name, Res);

        // NB: when creating immutable sampler array, we have to define the sampler as both resource and
        //     immutable sampler. The sampler will not be exposed as a shader variable though.
        //if (Res.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        //{
        //    if (FindImmutableSampler(Desc.ImmutableSamplers, Desc.NumImmutableSamplers, Res.ShaderStages, Res.Name,
        //                             Desc.UseCombinedTextureSamplers ? Desc.CombinedSamplerSuffix : nullptr) >= 0)
        //    {
        //        LOG_PRS_ERROR_AND_THROW("Sampler '", Res.Name, "' is defined as both shader resource and immutable sampler.");
        //    }
        //}
    }

    // Hash map of all immutable samplers by name
    std::unordered_multimap<HashMapStringKey, const ImmutableSamplerDesc&> ImtblSamplers;
    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];
        if (SamDesc.SamplerOrTextureName == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

        if (SamDesc.SamplerOrTextureName[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

        if (SamDesc.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        const auto sam_range = ImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
        for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
        {
            if ((sam_it->second.ShaderStages & SamDesc.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple immutable samplers with name '", SamDesc.SamplerOrTextureName,
                                        "' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }
            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                        SamDesc.SamplerOrTextureName, "' in shader stages ",
                                        GetShaderStagesString(SamDesc.ShaderStages), " and ",
                                        GetShaderStagesString(sam_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
            }
        }

        ImtblSamplers.emplace(SamDesc.SamplerOrTextureName, SamDesc);
    }

    if (Desc.UseCombinedTextureSamplers)
    {
        VERIFY_EXPR(Desc.CombinedSamplerSuffix != nullptr);

        // List of samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedSamplers;
        // List of immutable samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedImtblSamplers;
        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)
            {
                // Only texture SRVs can be combined with samplers
                continue;
            }

            {
                const String AssignedSamplerName = String{Res.Name} + Desc.CombinedSamplerSuffix;

                const auto sam_range = Resources.equal_range(AssignedSamplerName.c_str());
                for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
                {
                    const PipelineResourceDesc& Sam = sam_it->second;
                    VERIFY_EXPR(AssignedSamplerName == Sam.Name);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if (Sam.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_PRS_ERROR_AND_THROW("Resource '", Sam.Name, "' combined with texture '", Res.Name, "' is not a sampler.");
                        }

                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but sampler '", Sam.Name, "' assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different samplers in different stages. "
                                                    "Either use separate resources for different stages, or define the sampler for all stages that the resource uses.");
                        }

                        if (Sam.VarType != Res.VarType)
                        {
                            LOG_PRS_ERROR_AND_THROW("The type (", GetShaderVariableTypeLiteralName(Res.VarType), ") of texture resource '", Res.Name,
                                                    "' does not match the type (", GetShaderVariableTypeLiteralName(Sam.VarType),
                                                    ") of sampler '", Sam.Name, "' that is assigned to it.");
                        }

                        AssignedSamplers.emplace(Sam.Name, Sam.ShaderStages);

                        break;
                    }
                }
            }

            {
                const auto imtbl_sam_range = ImtblSamplers.equal_range(Res.Name);
                for (auto sam_it = imtbl_sam_range.first; sam_it != imtbl_sam_range.second; ++sam_it)
                {
                    const ImmutableSamplerDesc& Sam = sam_it->second;
                    VERIFY_EXPR(strcmp(Sam.SamplerOrTextureName, Res.Name) == 0);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but immutable sampler that is assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different immutable samples in different stages. "
                                                    "Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses.");
                        }

                        AssignedImtblSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);

                        break;
                    }
                }
            }
        }

        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                continue;

            auto assigned_sam_range = AssignedSamplers.equal_range(Res.Name);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == Res.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Sampler '", Res.Name, "' (", GetShaderStagesString(Res.ShaderStages), ")' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used.");
            }
        }

        for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];

            auto assigned_sam_range = AssignedImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == SamDesc.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Immutable sampler '", SamDesc.SamplerOrTextureName, "' (", GetShaderStagesString(SamDesc.ShaderStages), ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used.");
            }
        }
    }
}